

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveNode(GraphCycles *this,void *ptr)

{
  uint uVar1;
  Rep *pRVar2;
  Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *pVVar3;
  Node *pNVar4;
  Node **ppNVar5;
  Node *pNVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  int *piVar11;
  uint v;
  ulong unaff_RBP;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int32_t i;
  uint local_3c;
  GraphCycles *local_38;
  
  pRVar2 = this->rep_;
  pVVar3 = (pRVar2->ptrmap_).nodes_;
  piVar10 = (pRVar2->ptrmap_).table_._M_elems +
            (uint)((int)ptr + (int)((ulong)ptr / 0x3fffb) * -0x3fffb);
  do {
    uVar9 = (ulong)(uint)*piVar10;
    if (uVar9 == 0xffffffff) {
      v = 0xffffffff;
      break;
    }
    pNVar4 = pVVar3->ptr_[uVar9];
    uVar13 = pNVar4->masked_ptr ^ (ulong)ptr;
    piVar11 = &pNVar4->next_hash;
    if (uVar13 == 0xf03a5f7bf03a5f7b) {
      *piVar10 = *piVar11;
      *piVar11 = -1;
      piVar11 = piVar10;
      unaff_RBP = uVar9;
    }
    v = (uint)unaff_RBP;
    piVar10 = piVar11;
  } while (uVar13 != 0xf03a5f7bf03a5f7b);
  if (v != 0xffffffff) {
    ppNVar5 = (pRVar2->nodes_).ptr_;
    uVar9 = (ulong)v;
    pNVar4 = ppNVar5[uVar9];
    uVar15 = 0;
    local_3c = v;
    local_38 = this;
LAB_01074bd2:
    uVar1 = (pNVar4->out).table_.size_;
    uVar12 = uVar1;
    if (uVar1 < uVar15) {
      uVar12 = uVar15;
    }
    do {
      uVar14 = uVar15;
      if (uVar12 == uVar14) {
        uVar8 = (uint)uVar9;
        uVar15 = uVar12;
        break;
      }
      uVar8 = (pNVar4->out).table_.ptr_[uVar14];
      uVar15 = uVar14 + 1;
    } while ((int)uVar8 < 0);
    if (uVar14 < uVar1) {
      pNVar6 = ppNVar5[uVar8];
      uVar7 = synchronization_internal::anon_unknown_0::NodeSet::FindIndex(&pNVar6->in,v);
      piVar10 = (pNVar6->in).table_.ptr_;
      uVar9 = (ulong)uVar8;
      if (piVar10[uVar7] == v) {
        piVar10[uVar7] = -2;
        uVar9 = (ulong)uVar8;
      }
      goto LAB_01074bd2;
    }
    uVar15 = 0;
LAB_01074c33:
    uVar1 = (pNVar4->in).table_.size_;
    uVar12 = uVar1;
    if (uVar1 < uVar15) {
      uVar12 = uVar15;
    }
    do {
      uVar14 = uVar15;
      if (uVar12 == uVar14) {
        uVar8 = (uint)uVar9;
        uVar15 = uVar12;
        break;
      }
      uVar8 = (pNVar4->in).table_.ptr_[uVar14];
      uVar15 = uVar14 + 1;
    } while ((int)uVar8 < 0);
    if (uVar14 < uVar1) {
      pNVar6 = ppNVar5[uVar8];
      uVar7 = synchronization_internal::anon_unknown_0::NodeSet::FindIndex(&pNVar6->out,v);
      piVar10 = (pNVar6->out).table_.ptr_;
      uVar9 = (ulong)uVar8;
      if (piVar10[uVar7] == v) {
        piVar10[uVar7] = -2;
        uVar9 = (ulong)uVar8;
      }
      goto LAB_01074c33;
    }
    synchronization_internal::anon_unknown_0::NodeSet::Init(&pNVar4->in);
    synchronization_internal::anon_unknown_0::NodeSet::Init(&pNVar4->out);
    pNVar4->masked_ptr = 0xf03a5f7bf03a5f7b;
    if (pNVar4->version != 0xffffffff) {
      pNVar4->version = pNVar4->version + 1;
      synchronization_internal::anon_unknown_0::Vec<int>::push_back
                (&local_38->rep_->free_nodes_,(int *)&local_3c);
    }
  }
  return;
}

Assistant:

void GraphCycles::RemoveNode(void* ptr) {
  int32_t i = rep_->ptrmap_.Remove(ptr);
  if (i == -1) {
    return;
  }
  Node* x = rep_->nodes_[static_cast<uint32_t>(i)];
  HASH_FOR_EACH(y, x->out) {
    rep_->nodes_[static_cast<uint32_t>(y)]->in.erase(i);
  }
  HASH_FOR_EACH(y, x->in) {
    rep_->nodes_[static_cast<uint32_t>(y)]->out.erase(i);
  }
  x->in.clear();
  x->out.clear();
  x->masked_ptr = base_internal::HidePtr<void>(nullptr);
  if (x->version == std::numeric_limits<uint32_t>::max()) {
    // Cannot use x any more
  } else {
    x->version++;  // Invalidates all copies of node.
    rep_->free_nodes_.push_back(i);
  }
}